

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddTable.c
# Opt level: O0

int cuddInsertSubtables(DdManager *unique,int n,int level)

{
  uint value;
  int iVar1;
  DdNode *T;
  int iVar2;
  int iVar3;
  DdNode **ppDVar4;
  DdSubtable *__ptr;
  int *__ptr_00;
  int *__ptr_01;
  DdNode **ppDVar5;
  DdNode *pDVar6;
  ulong uVar7;
  int local_90;
  DdNode *zero;
  DdNode *one;
  int *newmap;
  int *newinvperm;
  int *newperm;
  uint numSlots;
  int reorderSave;
  int index;
  int j;
  int i;
  int newsize;
  int oldsize;
  DdNode *sentinel;
  DdNodePtr *newvars;
  DdNodePtr *newnodelist;
  DdSubtable *newsubtables;
  int level_local;
  int n_local;
  DdManager *unique_local;
  
  value = unique->initSlots;
  one = (DdNode *)0x0;
  iVar1 = unique->size;
  index = iVar1;
  if (unique->maxSize < iVar1 + n) {
    iVar2 = iVar1 + n + 10;
    __ptr = (DdSubtable *)malloc((long)iVar2 * 0x38);
    if (__ptr == (DdSubtable *)0x0) {
      unique->errorCode = CUDD_MEMORY_OUT;
      return 0;
    }
    ppDVar4 = (DdNode **)malloc((long)iVar2 << 3);
    if (ppDVar4 == (DdNode **)0x0) {
      unique->errorCode = CUDD_MEMORY_OUT;
      if (__ptr != (DdSubtable *)0x0) {
        free(__ptr);
      }
      return 0;
    }
    __ptr_00 = (int *)malloc((long)iVar2 << 2);
    if (__ptr_00 == (int *)0x0) {
      unique->errorCode = CUDD_MEMORY_OUT;
      if (__ptr != (DdSubtable *)0x0) {
        free(__ptr);
      }
      if (ppDVar4 != (DdNode **)0x0) {
        free(ppDVar4);
      }
      return 0;
    }
    __ptr_01 = (int *)malloc((long)iVar2 << 2);
    if (__ptr_01 == (int *)0x0) {
      unique->errorCode = CUDD_MEMORY_OUT;
      if (__ptr != (DdSubtable *)0x0) {
        free(__ptr);
      }
      if (ppDVar4 != (DdNode **)0x0) {
        free(ppDVar4);
      }
      if (__ptr_00 != (int *)0x0) {
        free(__ptr_00);
      }
      return 0;
    }
    if (unique->map != (int *)0x0) {
      one = (DdNode *)malloc((long)iVar2 << 2);
      if (one == (DdNode *)0x0) {
        unique->errorCode = CUDD_MEMORY_OUT;
        if (__ptr != (DdSubtable *)0x0) {
          free(__ptr);
        }
        if (ppDVar4 != (DdNode **)0x0) {
          free(ppDVar4);
        }
        if (__ptr_00 != (int *)0x0) {
          free(__ptr_00);
        }
        if (__ptr_01 != (int *)0x0) {
          free(__ptr_01);
        }
        return 0;
      }
      unique->memused = (long)(iVar2 - unique->maxSize) * 4 + unique->memused;
    }
    unique->memused =
         (long)(iVar2 - unique->maxSize) * ((ulong)(value + 1) * 8 + 0x40) + unique->memused;
    for (index = 0; iVar3 = level, index < level; index = index + 1) {
      __ptr[index].slots = unique->subtables[index].slots;
      __ptr[index].shift = unique->subtables[index].shift;
      __ptr[index].keys = unique->subtables[index].keys;
      __ptr[index].maxKeys = unique->subtables[index].maxKeys;
      __ptr[index].dead = unique->subtables[index].dead;
      __ptr[index].nodelist = unique->subtables[index].nodelist;
      __ptr[index].bindVar = unique->subtables[index].bindVar;
      __ptr[index].varType = unique->subtables[index].varType;
      __ptr[index].pairIndex = unique->subtables[index].pairIndex;
      __ptr[index].varHandled = unique->subtables[index].varHandled;
      __ptr[index].varToBeGrouped = unique->subtables[index].varToBeGrouped;
      ppDVar4[index] = unique->vars[index];
      __ptr_00[index] = unique->perm[index];
      __ptr_01[index] = unique->invperm[index];
    }
    while (index = iVar3, iVar3 = level, index < iVar1) {
      __ptr_00[index] = unique->perm[index];
      iVar3 = index + 1;
    }
    while (index = iVar3, iVar3 = level, index < level + n) {
      __ptr[index].slots = value;
      iVar3 = cuddComputeFloorLog2(value);
      __ptr[index].shift = 0x20 - iVar3;
      __ptr[index].keys = 0;
      __ptr[index].maxKeys = value << 2;
      __ptr[index].dead = 0;
      __ptr[index].bindVar = 0;
      __ptr[index].varType = CUDD_VAR_PRIMARY_INPUT;
      __ptr[index].pairIndex = 0;
      __ptr[index].varHandled = 0;
      __ptr[index].varToBeGrouped = CUDD_LAZY_NONE;
      __ptr_00[(iVar1 + index) - level] = index;
      __ptr_01[index] = (iVar1 + index) - level;
      ppDVar5 = (DdNode **)malloc((ulong)value << 3);
      __ptr[index].nodelist = ppDVar5;
      if (ppDVar5 == (DdNode **)0x0) {
        unique->errorCode = CUDD_MEMORY_OUT;
        return 0;
      }
      for (reorderSave = 0; (uint)reorderSave < value; reorderSave = reorderSave + 1) {
        ppDVar5[reorderSave] = &unique->sentinel;
      }
      iVar3 = index + 1;
    }
    while (index = iVar3, index < iVar1) {
      __ptr[index + n].slots = unique->subtables[index].slots;
      __ptr[index + n].shift = unique->subtables[index].shift;
      __ptr[index + n].keys = unique->subtables[index].keys;
      __ptr[index + n].maxKeys = unique->subtables[index].maxKeys;
      __ptr[index + n].dead = unique->subtables[index].dead;
      __ptr[index + n].nodelist = unique->subtables[index].nodelist;
      __ptr[index + n].bindVar = unique->subtables[index].bindVar;
      __ptr[index + n].varType = unique->subtables[index].varType;
      __ptr[index + n].pairIndex = unique->subtables[index].pairIndex;
      __ptr[index + n].varHandled = unique->subtables[index].varHandled;
      __ptr[index + n].varToBeGrouped = unique->subtables[index].varToBeGrouped;
      ppDVar4[index] = unique->vars[index];
      iVar3 = unique->invperm[index];
      __ptr_01[index + n] = iVar3;
      __ptr_00[iVar3] = n + __ptr_00[iVar3];
      iVar3 = index + 1;
    }
    if (unique->map != (int *)0x0) {
      for (index = 0; iVar3 = iVar1, index < iVar1; index = index + 1) {
        (&one->index)[index] = unique->map[index];
      }
      while (index = iVar3, index < iVar1 + n) {
        (&one->index)[index] = index;
        iVar3 = index + 1;
      }
      if (unique->map != (int *)0x0) {
        free(unique->map);
        unique->map = (int *)0x0;
      }
      unique->map = (int *)one;
    }
    if (unique->subtables != (DdSubtable *)0x0) {
      free(unique->subtables);
      unique->subtables = (DdSubtable *)0x0;
    }
    unique->subtables = __ptr;
    unique->maxSize = iVar2;
    if (unique->vars != (DdNode **)0x0) {
      free(unique->vars);
      unique->vars = (DdNode **)0x0;
    }
    unique->vars = ppDVar4;
    if (unique->perm != (int *)0x0) {
      free(unique->perm);
      unique->perm = (int *)0x0;
    }
    unique->perm = __ptr_00;
    if (unique->invperm != (int *)0x0) {
      free(unique->invperm);
      unique->invperm = (int *)0x0;
    }
    unique->invperm = __ptr_01;
    if (unique->maxSizeZ < iVar2) {
      if (unique->stack != (DdNode **)0x0) {
        free(unique->stack);
        unique->stack = (DdNode **)0x0;
      }
      ppDVar4 = (DdNode **)malloc((long)(iVar1 + n + 0xb) << 3);
      unique->stack = ppDVar4;
      if (unique->stack == (DdNode **)0x0) {
        unique->errorCode = CUDD_MEMORY_OUT;
        return 0;
      }
      *unique->stack = (DdNode *)0x0;
      if (unique->maxSize < unique->maxSizeZ) {
        local_90 = unique->maxSizeZ;
      }
      else {
        local_90 = unique->maxSize;
      }
      unique->memused = (long)(iVar2 - local_90) * 8 + unique->memused;
    }
  }
  else {
    while (index = index + -1, level <= index) {
      unique->subtables[index + n].slots = unique->subtables[index].slots;
      unique->subtables[index + n].shift = unique->subtables[index].shift;
      unique->subtables[index + n].keys = unique->subtables[index].keys;
      unique->subtables[index + n].maxKeys = unique->subtables[index].maxKeys;
      unique->subtables[index + n].dead = unique->subtables[index].dead;
      unique->subtables[index + n].nodelist = unique->subtables[index].nodelist;
      unique->subtables[index + n].bindVar = unique->subtables[index].bindVar;
      unique->subtables[index + n].varType = unique->subtables[index].varType;
      unique->subtables[index + n].pairIndex = unique->subtables[index].pairIndex;
      unique->subtables[index + n].varHandled = unique->subtables[index].varHandled;
      unique->subtables[index + n].varToBeGrouped = unique->subtables[index].varToBeGrouped;
      iVar2 = unique->invperm[index];
      unique->invperm[index + n] = iVar2;
      unique->perm[iVar2] = n + unique->perm[iVar2];
    }
    for (index = 0; index < n; index = index + 1) {
      unique->subtables[level + index].slots = value;
      iVar2 = cuddComputeFloorLog2(value);
      unique->subtables[level + index].shift = 0x20 - iVar2;
      unique->subtables[level + index].keys = 0;
      unique->subtables[level + index].maxKeys = value << 2;
      unique->subtables[level + index].dead = 0;
      unique->subtables[level + index].bindVar = 0;
      unique->subtables[level + index].varType = CUDD_VAR_PRIMARY_INPUT;
      unique->subtables[level + index].pairIndex = 0;
      unique->subtables[level + index].varHandled = 0;
      unique->subtables[level + index].varToBeGrouped = CUDD_LAZY_NONE;
      unique->perm[iVar1 + index] = level + index;
      unique->invperm[level + index] = iVar1 + index;
      ppDVar4 = (DdNode **)malloc((ulong)value << 3);
      unique->subtables[level + index].nodelist = ppDVar4;
      if (ppDVar4 == (DdNode **)0x0) {
        unique->errorCode = CUDD_MEMORY_OUT;
        return 0;
      }
      for (reorderSave = 0; (uint)reorderSave < value; reorderSave = reorderSave + 1) {
        ppDVar4[reorderSave] = &unique->sentinel;
      }
    }
    if (unique->map != (int *)0x0) {
      for (index = 0; index < n; index = index + 1) {
        unique->map[iVar1 + index] = iVar1 + index;
      }
    }
  }
  unique->slots = n * value + unique->slots;
  ddFixLimits(unique);
  unique->size = n + unique->size;
  T = unique->one;
  iVar2 = unique->autoDyn;
  unique->autoDyn = 0;
  index = iVar1;
  while( true ) {
    if (iVar1 + n <= index) {
      if (unique->tree != (MtrNode *)0x0) {
        unique->tree->size = n + unique->tree->size;
        unique->tree->index = *unique->invperm;
        ddPatchTree(unique,unique->tree);
      }
      unique->autoDyn = iVar2;
      return 1;
    }
    pDVar6 = cuddUniqueInter(unique,index,T,(DdNode *)((ulong)T ^ 1));
    unique->vars[index] = pDVar6;
    if (unique->vars[index] == (DdNode *)0x0) break;
    uVar7 = (ulong)unique->vars[index] & 0xfffffffffffffffe;
    *(int *)(uVar7 + 4) = *(int *)(uVar7 + 4) + 1;
    index = index + 1;
  }
  unique->autoDyn = iVar2;
  for (reorderSave = iVar1; iVar2 = level, reorderSave < index; reorderSave = reorderSave + 1) {
    Cudd_IterDerefBdd(unique,unique->vars[reorderSave]);
    unique->vars[reorderSave]->next = unique->nextFree;
    unique->nextFree = unique->vars[reorderSave];
    unique->vars[reorderSave] = (DdNode *)0x0;
  }
  while (reorderSave = iVar2, reorderSave < iVar1) {
    unique->subtables[reorderSave].slots = unique->subtables[reorderSave + n].slots;
    unique->subtables[reorderSave].slots = unique->subtables[reorderSave + n].slots;
    unique->subtables[reorderSave].shift = unique->subtables[reorderSave + n].shift;
    unique->subtables[reorderSave].keys = unique->subtables[reorderSave + n].keys;
    unique->subtables[reorderSave].maxKeys = unique->subtables[reorderSave + n].maxKeys;
    unique->subtables[reorderSave].dead = unique->subtables[reorderSave + n].dead;
    if (unique->subtables[reorderSave].nodelist != (DdNode **)0x0) {
      free(unique->subtables[reorderSave].nodelist);
      unique->subtables[reorderSave].nodelist = (DdNode **)0x0;
    }
    unique->subtables[reorderSave].nodelist = unique->subtables[reorderSave + n].nodelist;
    unique->subtables[reorderSave + n].nodelist = (DdNode **)0x0;
    unique->subtables[reorderSave].bindVar = unique->subtables[reorderSave + n].bindVar;
    unique->subtables[reorderSave].varType = unique->subtables[reorderSave + n].varType;
    unique->subtables[reorderSave].pairIndex = unique->subtables[reorderSave + n].pairIndex;
    unique->subtables[reorderSave].varHandled = unique->subtables[reorderSave + n].varHandled;
    unique->subtables[reorderSave].varToBeGrouped =
         unique->subtables[reorderSave + n].varToBeGrouped;
    iVar2 = unique->invperm[reorderSave + n];
    unique->invperm[reorderSave] = iVar2;
    unique->perm[iVar2] = unique->perm[iVar2] - n;
    iVar2 = reorderSave + 1;
  }
  unique->size = iVar1;
  unique->slots = unique->slots - n * value;
  ddFixLimits(unique);
  Cudd_DebugCheck(unique);
  return 0;
}

Assistant:

int
cuddInsertSubtables(
  DdManager * unique,
  int  n,
  int  level)
{
    DdSubtable *newsubtables;
    DdNodePtr *newnodelist;
    DdNodePtr *newvars;
    DdNode *sentinel = &(unique->sentinel);
    int oldsize,newsize;
    int i,j,index,reorderSave;
    unsigned int numSlots = unique->initSlots;
    int *newperm, *newinvperm, *newmap=NULL;
    DdNode *one, *zero;

#ifdef DD_DEBUG
    assert(n > 0 && level < unique->size);
#endif

    oldsize = unique->size;
    /* Easy case: there is still room in the current table. */
    if (oldsize + n <= unique->maxSize) {
        /* Shift the tables at and below level. */
        for (i = oldsize - 1; i >= level; i--) {
            unique->subtables[i+n].slots    = unique->subtables[i].slots;
            unique->subtables[i+n].shift    = unique->subtables[i].shift;
            unique->subtables[i+n].keys     = unique->subtables[i].keys;
            unique->subtables[i+n].maxKeys  = unique->subtables[i].maxKeys;
            unique->subtables[i+n].dead     = unique->subtables[i].dead;
            unique->subtables[i+n].nodelist = unique->subtables[i].nodelist;
            unique->subtables[i+n].bindVar  = unique->subtables[i].bindVar;
            unique->subtables[i+n].varType  = unique->subtables[i].varType;
            unique->subtables[i+n].pairIndex  = unique->subtables[i].pairIndex;
            unique->subtables[i+n].varHandled = unique->subtables[i].varHandled;
            unique->subtables[i+n].varToBeGrouped =
                unique->subtables[i].varToBeGrouped;

            index                           = unique->invperm[i];
            unique->invperm[i+n]            = index;
            unique->perm[index]            += n;
        }
        /* Create new subtables. */
        for (i = 0; i < n; i++) {
            unique->subtables[level+i].slots = numSlots;
            unique->subtables[level+i].shift = sizeof(int) * 8 -
                cuddComputeFloorLog2(numSlots);
            unique->subtables[level+i].keys = 0;
            unique->subtables[level+i].maxKeys = numSlots * DD_MAX_SUBTABLE_DENSITY;
            unique->subtables[level+i].dead = 0;
            unique->subtables[level+i].bindVar = 0;
            unique->subtables[level+i].varType = CUDD_VAR_PRIMARY_INPUT;
            unique->subtables[level+i].pairIndex = 0;
            unique->subtables[level+i].varHandled = 0;
            unique->subtables[level+i].varToBeGrouped = CUDD_LAZY_NONE;

            unique->perm[oldsize+i] = level + i;
            unique->invperm[level+i] = oldsize + i;
            newnodelist = unique->subtables[level+i].nodelist =
                ABC_ALLOC(DdNodePtr, numSlots);
            if (newnodelist == NULL) {
                unique->errorCode = CUDD_MEMORY_OUT;
                return(0);
            }
            for (j = 0; (unsigned) j < numSlots; j++) {
                newnodelist[j] = sentinel;
            }
        }
        if (unique->map != NULL) {
            for (i = 0; i < n; i++) {
                unique->map[oldsize+i] = oldsize + i;
            }
        }
    } else {
        /* The current table is too small: we need to allocate a new,
        ** larger one; move all old subtables, and initialize the new
        ** subtables.
        */
        newsize = oldsize + n + DD_DEFAULT_RESIZE;
#ifdef DD_VERBOSE
        (void) fprintf(unique->err,
                       "Increasing the table size from %d to %d\n",
            unique->maxSize, newsize);
#endif
        /* Allocate memory for new arrays (except nodelists). */
        newsubtables = ABC_ALLOC(DdSubtable,newsize);
        if (newsubtables == NULL) {
            unique->errorCode = CUDD_MEMORY_OUT;
            return(0);
        }
        newvars = ABC_ALLOC(DdNodePtr,newsize);
        if (newvars == NULL) {
            unique->errorCode = CUDD_MEMORY_OUT;
            ABC_FREE(newsubtables);
            return(0);
        }
        newperm = ABC_ALLOC(int,newsize);
        if (newperm == NULL) {
            unique->errorCode = CUDD_MEMORY_OUT;
            ABC_FREE(newsubtables);
            ABC_FREE(newvars);
            return(0);
        }
        newinvperm = ABC_ALLOC(int,newsize);
        if (newinvperm == NULL) {
            unique->errorCode = CUDD_MEMORY_OUT;
            ABC_FREE(newsubtables);
            ABC_FREE(newvars);
            ABC_FREE(newperm);
            return(0);
        }
        if (unique->map != NULL) {
            newmap = ABC_ALLOC(int,newsize);
            if (newmap == NULL) {
                unique->errorCode = CUDD_MEMORY_OUT;
                ABC_FREE(newsubtables);
                ABC_FREE(newvars);
                ABC_FREE(newperm);
                ABC_FREE(newinvperm);
                return(0);
            }
            unique->memused += (newsize - unique->maxSize) * sizeof(int);
        }
        unique->memused += (newsize - unique->maxSize) * ((numSlots+1) *
            sizeof(DdNode *) + 2 * sizeof(int) + sizeof(DdSubtable));
        /* Copy levels before insertion points from old tables. */
        for (i = 0; i < level; i++) {
            newsubtables[i].slots = unique->subtables[i].slots;
            newsubtables[i].shift = unique->subtables[i].shift;
            newsubtables[i].keys = unique->subtables[i].keys;
            newsubtables[i].maxKeys = unique->subtables[i].maxKeys;
            newsubtables[i].dead = unique->subtables[i].dead;
            newsubtables[i].nodelist = unique->subtables[i].nodelist;
            newsubtables[i].bindVar = unique->subtables[i].bindVar;
            newsubtables[i].varType = unique->subtables[i].varType;
            newsubtables[i].pairIndex = unique->subtables[i].pairIndex;
            newsubtables[i].varHandled = unique->subtables[i].varHandled;
            newsubtables[i].varToBeGrouped = unique->subtables[i].varToBeGrouped;

            newvars[i] = unique->vars[i];
            newperm[i] = unique->perm[i];
            newinvperm[i] = unique->invperm[i];
        }
        /* Finish initializing permutation for new table to old one. */
        for (i = level; i < oldsize; i++) {
            newperm[i] = unique->perm[i];
        }
        /* Initialize new levels. */
        for (i = level; i < level + n; i++) {
            newsubtables[i].slots = numSlots;
            newsubtables[i].shift = sizeof(int) * 8 -
                cuddComputeFloorLog2(numSlots);
            newsubtables[i].keys = 0;
            newsubtables[i].maxKeys = numSlots * DD_MAX_SUBTABLE_DENSITY;
            newsubtables[i].dead = 0;
            newsubtables[i].bindVar = 0;
            newsubtables[i].varType = CUDD_VAR_PRIMARY_INPUT;
            newsubtables[i].pairIndex = 0;
            newsubtables[i].varHandled = 0;
            newsubtables[i].varToBeGrouped = CUDD_LAZY_NONE;

            newperm[oldsize + i - level] = i;
            newinvperm[i] = oldsize + i - level;
            newnodelist = newsubtables[i].nodelist = ABC_ALLOC(DdNodePtr, numSlots);
            if (newnodelist == NULL) {
                /* We are going to leak some memory.  We should clean up. */
                unique->errorCode = CUDD_MEMORY_OUT;
                return(0);
            }
            for (j = 0; (unsigned) j < numSlots; j++) {
                newnodelist[j] = sentinel;
            }
        }
        /* Copy the old tables for levels past the insertion point. */
        for (i = level; i < oldsize; i++) {
            newsubtables[i+n].slots    = unique->subtables[i].slots;
            newsubtables[i+n].shift    = unique->subtables[i].shift;
            newsubtables[i+n].keys     = unique->subtables[i].keys;
            newsubtables[i+n].maxKeys  = unique->subtables[i].maxKeys;
            newsubtables[i+n].dead     = unique->subtables[i].dead;
            newsubtables[i+n].nodelist = unique->subtables[i].nodelist;
            newsubtables[i+n].bindVar  = unique->subtables[i].bindVar;
            newsubtables[i+n].varType  = unique->subtables[i].varType;
            newsubtables[i+n].pairIndex  = unique->subtables[i].pairIndex;
            newsubtables[i+n].varHandled  = unique->subtables[i].varHandled;
            newsubtables[i+n].varToBeGrouped  =
                unique->subtables[i].varToBeGrouped;

            newvars[i]                 = unique->vars[i];
            index                      = unique->invperm[i];
            newinvperm[i+n]            = index;
            newperm[index]            += n;
        }
        /* Update the map. */
        if (unique->map != NULL) {
            for (i = 0; i < oldsize; i++) {
                newmap[i] = unique->map[i];
            }
            for (i = oldsize; i < oldsize + n; i++) {
                newmap[i] = i;
            }
            ABC_FREE(unique->map);
            unique->map = newmap;
        }
        /* Install the new tables and free the old ones. */
        ABC_FREE(unique->subtables);
        unique->subtables = newsubtables;
        unique->maxSize = newsize;
        ABC_FREE(unique->vars);
        unique->vars = newvars;
        ABC_FREE(unique->perm);
        unique->perm = newperm;
        ABC_FREE(unique->invperm);
        unique->invperm = newinvperm;
        /* Update the stack for iterative procedures. */
        if (newsize > unique->maxSizeZ) {
            ABC_FREE(unique->stack);
            unique->stack = ABC_ALLOC(DdNodePtr,newsize + 1);
            if (unique->stack == NULL) {
                unique->errorCode = CUDD_MEMORY_OUT;
                return(0);
            }
            unique->stack[0] = NULL; /* to suppress harmless UMR */
            unique->memused +=
                (newsize - ddMax(unique->maxSize,unique->maxSizeZ))
                * sizeof(DdNode *);
        }
    }
    /* Update manager parameters to account for the new subtables. */
    unique->slots += n * numSlots;
    ddFixLimits(unique);
    unique->size += n;

    /* Now that the table is in a coherent state, create the new
    ** projection functions. We need to temporarily disable reordering,
    ** because we cannot reorder without projection functions in place.
    **/
    one = unique->one;
    zero = Cudd_Not(one);

    reorderSave = unique->autoDyn;
    unique->autoDyn = 0;
    for (i = oldsize; i < oldsize + n; i++) {
        unique->vars[i] = cuddUniqueInter(unique,i,one,zero);
        if (unique->vars[i] == NULL) {
            unique->autoDyn = reorderSave;
            /* Shift everything back so table remains coherent. */
            for (j = oldsize; j < i; j++) {
                Cudd_IterDerefBdd(unique,unique->vars[j]);
                cuddDeallocNode(unique,unique->vars[j]);
                unique->vars[j] = NULL;
            }
            for (j = level; j < oldsize; j++) {
                unique->subtables[j].slots    = unique->subtables[j+n].slots;
                unique->subtables[j].slots    = unique->subtables[j+n].slots;
                unique->subtables[j].shift    = unique->subtables[j+n].shift;
                unique->subtables[j].keys     = unique->subtables[j+n].keys;
                unique->subtables[j].maxKeys  =
                    unique->subtables[j+n].maxKeys;
                unique->subtables[j].dead     = unique->subtables[j+n].dead;
                ABC_FREE(unique->subtables[j].nodelist);
                unique->subtables[j].nodelist =
                    unique->subtables[j+n].nodelist;
                unique->subtables[j+n].nodelist = NULL;
                unique->subtables[j].bindVar  =
                    unique->subtables[j+n].bindVar;
                unique->subtables[j].varType  =
                    unique->subtables[j+n].varType;
                unique->subtables[j].pairIndex =
                    unique->subtables[j+n].pairIndex;
                unique->subtables[j].varHandled =
                    unique->subtables[j+n].varHandled;
                unique->subtables[j].varToBeGrouped =
                    unique->subtables[j+n].varToBeGrouped;
                index                         = unique->invperm[j+n];
                unique->invperm[j]            = index;
                unique->perm[index]          -= n;
            }
            unique->size = oldsize;
            unique->slots -= n * numSlots;
            ddFixLimits(unique);
            (void) Cudd_DebugCheck(unique);
            return(0);
        }
        cuddRef(unique->vars[i]);
    }
    if (unique->tree != NULL) {
        unique->tree->size += n;
        unique->tree->index = unique->invperm[0];
        ddPatchTree(unique,unique->tree);
    }
    unique->autoDyn = reorderSave;

    return(1);

}